

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O0

bool __thiscall
DIS::StandardVariableSpecification::operator==
          (StandardVariableSpecification *this,StandardVariableSpecification *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  StandardVariableSpecification *rhs_local;
  StandardVariableSpecification *this_local;
  
  idx._7_1_ = true;
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
            ::size(&this->_standardVariables);
    if (sVar2 <= local_28) break;
    this_00 = std::
              vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
              ::operator[](&this->_standardVariables,local_28);
    rhs_00 = std::
             vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
             ::operator[](&rhs->_standardVariables,local_28);
    bVar1 = SimulationManagementPduHeader::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool StandardVariableSpecification::operator ==(const StandardVariableSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _standardVariables.size(); idx++)
     {
        if( ! ( _standardVariables[idx] == rhs._standardVariables[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }